

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  int j;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  void *pvVar12;
  ulong uVar13;
  ulong uVar14;
  int j_1;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int i_2;
  ulong uVar19;
  bool bVar20;
  float sum;
  float fVar21;
  float fVar22;
  float fVar23;
  long local_2b8;
  Mat outm;
  Mat xkm;
  Mat outm_3;
  Mat xqk;
  Mat xqkv;
  Mat xv;
  Mat xk;
  Mat xq;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar1 == 0x48;
  lVar18 = 0x48;
  if (bVar20) {
    lVar18 = 0;
  }
  lVar9 = 0x90;
  if (bVar20) {
    lVar9 = 0;
  }
  _h = pMVar1->h;
  uVar19 = (ulong)_h;
  uVar3 = (long)this->embed_dim / (long)this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,_h,4,opt->blob_allocator);
  iVar15 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar15 = (int)uVar3;
    Mat::Mat(&xq,iVar15,_h,this->num_head,4,opt->workspace_allocator);
    Mat::Mat(&xk,iVar15,_h,this->num_head,4,opt->workspace_allocator);
    Mat::Mat(&xv,_h,iVar15,this->num_head,4,opt->workspace_allocator);
    Mat::Mat(&xqk,_h,_h,this->num_head,4,opt->workspace_allocator);
    Mat::Mat(&xqkv,iVar15,this->num_head,_h,4,opt->workspace_allocator);
    local_2b8 = 0;
    uVar14 = 0;
    if (0 < iVar15) {
      uVar14 = uVar3 & 0xffffffff;
    }
    uVar3 = 0;
    if (0 < (int)_h) {
      uVar3 = (ulong)_h;
    }
    for (lVar8 = 0; lVar8 < this->num_head; lVar8 = lVar8 + 1) {
      iVar5 = (int)lVar8;
      Mat::channel(&outm,&xq,iVar5);
      lVar7 = lVar8 * iVar15;
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        iVar4 = this->embed_dim;
        pvVar10 = (this->q_bias_data).data;
        iVar11 = 0;
        if (0 < iVar4) {
          iVar11 = iVar4;
        }
        pvVar12 = (void *)(local_2b8 * iVar4 + (long)(this->q_weight_data).data);
        for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
          fVar21 = *(float *)((long)pvVar10 + (uVar13 + lVar7) * 4);
          for (lVar16 = 0; iVar11 != (int)lVar16; lVar16 = lVar16 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar12 + lVar16 * 4) *
                              *(float *)((long)pMVar1->data +
                                        lVar16 * 4 + pMVar1->elemsize * uVar6 * (long)pMVar1->w);
          }
          *(float *)((long)outm.data + uVar13 * 4 + (long)outm.w * outm.elemsize * uVar6) =
               fVar21 * (1.0 / SQRT((float)iVar15));
          pvVar12 = (void *)((long)pvVar12 + (long)iVar4 * 4);
        }
      }
      Mat::~Mat(&outm);
      Mat::channel(&outm,&xk,iVar5);
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        iVar4 = this->embed_dim;
        pvVar10 = (this->k_bias_data).data;
        iVar11 = 0;
        if (0 < iVar4) {
          iVar11 = iVar4;
        }
        pvVar12 = (void *)(local_2b8 * iVar4 + (long)(this->k_weight_data).data);
        for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
          fVar21 = *(float *)((long)pvVar10 + (uVar13 + lVar7) * 4);
          for (lVar16 = 0; iVar11 != (int)lVar16; lVar16 = lVar16 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar12 + lVar16 * 4) *
                              *(float *)(*(long *)((long)&pMVar1->elemsize + lVar18) * uVar6 *
                                         (long)*(int *)((long)&pMVar1->w + lVar18) +
                                         *(long *)((long)&pMVar1->data + lVar18) + lVar16 * 4);
          }
          *(float *)((long)outm.data + uVar13 * 4 + (long)outm.w * outm.elemsize * uVar6) = fVar21;
          pvVar12 = (void *)((long)pvVar12 + (long)iVar4 * 4);
        }
      }
      Mat::~Mat(&outm);
      Mat::channel(&outm,&xv,iVar5);
      lVar16 = local_2b8;
      for (uVar6 = 0; uVar6 != uVar14; uVar6 = uVar6 + 1) {
        iVar4 = this->embed_dim;
        pvVar10 = (this->v_bias_data).data;
        iVar11 = 0;
        if (0 < iVar4) {
          iVar11 = iVar4;
        }
        pvVar12 = (this->v_weight_data).data;
        for (uVar13 = 0; uVar13 != uVar3; uVar13 = uVar13 + 1) {
          fVar21 = *(float *)((long)pvVar10 + (uVar6 + lVar7) * 4);
          for (lVar17 = 0; iVar11 != (int)lVar17; lVar17 = lVar17 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar12 + lVar17 * 4 + iVar4 * lVar16) *
                              *(float *)(*(long *)((long)&pMVar1->elemsize + lVar9) * uVar13 *
                                         (long)*(int *)((long)&pMVar1->w + lVar9) +
                                         *(long *)((long)&pMVar1->data + lVar9) + lVar17 * 4);
          }
          *(float *)((long)outm.data + uVar13 * 4 + (long)outm.w * uVar6 * outm.elemsize) = fVar21;
        }
        lVar16 = lVar16 + 4;
      }
      Mat::~Mat(&outm);
      Mat::channel(&outm,&xq,iVar5);
      Mat::channel(&xkm,&xk,iVar5);
      Mat::channel(&outm_3,&xqk,iVar5);
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        pvVar10 = xkm.data;
        for (uVar13 = 0; uVar13 != uVar19; uVar13 = uVar13 + 1) {
          fVar21 = 0.0;
          for (lVar7 = 0; (int)uVar14 != (int)lVar7; lVar7 = lVar7 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar10 + lVar7 * 4) *
                              *(float *)((long)outm.data +
                                        lVar7 * 4 + outm.elemsize * uVar6 * (long)outm.w);
          }
          *(float *)((long)outm_3.data + uVar13 * 4 + (long)outm_3.w * outm_3.elemsize * uVar6) =
               fVar21;
          pvVar10 = (void *)((long)pvVar10 + (long)xkm.w * xkm.elemsize);
        }
      }
      Mat::~Mat(&outm_3);
      Mat::~Mat(&xkm);
      Mat::~Mat(&outm);
      Mat::channel(&outm,&xqk,iVar5);
      lVar7 = (long)outm.w * outm.elemsize;
      pvVar10 = outm.data;
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        fVar21 = -3.4028235e+38;
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          fVar23 = *(float *)((long)pvVar10 + uVar13 * 4);
          if (fVar21 <= fVar23) {
            fVar21 = fVar23;
          }
        }
        fVar23 = 0.0;
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          fVar22 = expf(*(float *)((long)pvVar10 + uVar13 * 4) - fVar21);
          *(float *)((long)pvVar10 + uVar13 * 4) = fVar22;
          fVar23 = fVar23 + fVar22;
        }
        for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
          *(float *)((long)pvVar10 + uVar13 * 4) =
               *(float *)((long)pvVar10 + uVar13 * 4) * (1.0 / fVar23);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar7);
      }
      Mat::~Mat(&outm);
      Mat::channel(&outm,&xqk,iVar5);
      Mat::channel(&xkm,&xv,iVar5);
      for (uVar6 = 0; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        Mat::channel(&outm_3,&xqkv,(int)uVar6);
        pvVar10 = outm_3.data;
        lVar7 = outm_3.w * lVar8 * outm_3.elemsize;
        Mat::~Mat(&outm_3);
        pvVar12 = xkm.data;
        for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
          fVar21 = 0.0;
          for (lVar16 = 0; _h != (uint)lVar16; lVar16 = lVar16 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar12 + lVar16 * 4) *
                              *(float *)((long)outm.data +
                                        lVar16 * 4 + outm.elemsize * uVar6 * (long)outm.w);
          }
          *(float *)((long)pvVar10 + uVar13 * 4 + lVar7) = fVar21;
          pvVar12 = (void *)((long)pvVar12 + (long)xkm.w * xkm.elemsize);
        }
      }
      Mat::~Mat(&xkm);
      Mat::~Mat(&outm);
      local_2b8 = local_2b8 + (long)iVar15 * 4;
    }
    for (uVar19 = 0; uVar19 != uVar3; uVar19 = uVar19 + 1) {
      iVar15 = this_00->w;
      sVar2 = this_00->elemsize;
      pvVar10 = this_00->data;
      iVar5 = this->embed_dim;
      for (lVar18 = 0; lVar18 < iVar5; lVar18 = lVar18 + 1) {
        Mat::channel(&outm,&xqkv,(int)uVar19);
        pvVar12 = outm.data;
        Mat::~Mat(&outm);
        iVar5 = this->embed_dim;
        iVar4 = 0;
        if (0 < iVar5) {
          iVar4 = iVar5;
        }
        fVar21 = *(float *)((long)(this->out_bias_data).data + lVar18 * 4);
        for (lVar9 = 0; iVar4 != (int)lVar9; lVar9 = lVar9 + 1) {
          fVar21 = fVar21 + *(float *)((long)(this->out_weight_data).data +
                                      lVar9 * 4 + (long)((int)lVar18 * iVar5) * 4) *
                            *(float *)((long)pvVar12 + lVar9 * 4);
        }
        *(float *)((long)pvVar10 + lVar18 * 4 + (long)iVar15 * uVar19 * sVar2) = fVar21;
      }
    }
    Mat::~Mat(&xqkv);
    Mat::~Mat(&xqk);
    Mat::~Mat(&xv);
    Mat::~Mat(&xk);
    Mat::~Mat(&xq);
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}